

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_TEXM3X3PAD(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x01','\x04');
  if (iVar1 != 0) {
    fail(ctx,"TEXM3X2TEX opcode not available after Shader Model 1.3");
  }
  state_texops(ctx,"TEXM3X3PAD",0,0);
  if (ctx->texm3x3pad_dst0 == -1) {
    ctx->texm3x3pad_src0 = ctx->source_args[0].regnum;
    ctx->texm3x3pad_dst0 = (ctx->dest_arg).regnum;
  }
  else if (ctx->texm3x3pad_dst1 == -1) {
    ctx->texm3x3pad_src1 = ctx->source_args[0].regnum;
    ctx->texm3x3pad_dst1 = (ctx->dest_arg).regnum;
  }
  return;
}

Assistant:

static void state_TEXM3X3PAD(Context *ctx)
{
    if (shader_version_atleast(ctx, 1, 4))
        fail(ctx, "TEXM3X2TEX opcode not available after Shader Model 1.3");
    state_texops(ctx, "TEXM3X3PAD", 0, 0);

    // !!! FIXME: check for correct opcode existance and order more rigorously?
    if (ctx->texm3x3pad_dst0 == -1)
    {
        ctx->texm3x3pad_src0 = ctx->source_args[0].regnum;
        ctx->texm3x3pad_dst0 = ctx->dest_arg.regnum;
    } // if
    else if (ctx->texm3x3pad_dst1 == -1)
    {
        ctx->texm3x3pad_src1 = ctx->source_args[0].regnum;
        ctx->texm3x3pad_dst1 = ctx->dest_arg.regnum;
    } // else
}